

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landb.cpp
# Opt level: O0

bool __thiscall lan::db::declare(db *this,string *target,string *name,db_bit_type type)

{
  db_bit *pdVar1;
  db_bits *pdVar2;
  invalid_argument *this_00;
  bool local_13a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  string local_e0;
  undefined1 local_b9;
  invalid_argument *local_b8;
  byte local_a9;
  string local_a8;
  byte local_81;
  string local_80;
  string local_50;
  db_bit_type local_2c;
  string *psStack_28;
  db_bit_type type_local;
  string *name_local;
  string *target_local;
  db *this_local;
  
  local_2c = type;
  psStack_28 = name;
  name_local = target;
  target_local = (string *)this;
  std::__cxx11::string::string((string *)&local_50,(string *)target);
  local_81 = 0;
  local_a9 = 0;
  local_b9 = 0;
  pdVar2 = find_rec(this,&local_50,Container,this->first);
  this->data = pdVar2;
  if (pdVar2 != (db_bits *)0x0) {
    if (this->data->lin == (db_bit *)0x0) {
      pdVar1 = this->data;
      std::__cxx11::string::string((string *)&local_a8,(string *)name);
      local_a9 = 1;
      local_13a = init<int>(this,pdVar1,&local_a8,0,local_2c);
    }
    else {
      pdVar1 = this->data;
      std::__cxx11::string::string((string *)&local_80,(string *)name);
      local_81 = 1;
      local_13a = append<int>(this,pdVar1,&local_80,0,local_2c);
    }
    this_local._7_1_ = local_13a;
    if ((local_a9 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_a8);
    }
    if ((local_81 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_80);
    }
    std::__cxx11::string::~string((string *)&local_50);
    return (bool)(this_local._7_1_ & 1);
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  local_b9 = 1;
  local_b8 = this_00;
  std::operator+(&local_100,target,"{Container}");
  error_string(&local_e0,this,_bit_name_error,&local_100);
  std::invalid_argument::invalid_argument(this_00,(string *)&local_e0);
  local_b9 = 0;
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

bool db::declare(std::string const target, std::string const name, db_bit_type const type){
            return ((data = find_rec(target, lan::Container, first)))
            ? (data->lin) ? append(data, name, 0, type) : init(data, name, 0, type): throw lan::errors::bit_name_error(error_string(errors::_private::_bit_name_error, target+("{Container}")));
        }